

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::FileDescriptorSet::FileDescriptorSet(FileDescriptorSet *this)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__FileDescriptorSet_0072eee0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = 0;
  (this->file_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->file_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->file_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->file_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  if (this != (FileDescriptorSet *)&_FileDescriptorSet_default_instance_) {
    protobuf_google_2fprotobuf_2fdescriptor_2eproto::InitDefaults();
  }
  this->_cached_size_ = 0;
  return;
}

Assistant:

FileDescriptorSet::FileDescriptorSet()
  : ::google::protobuf::Message(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_google_2fprotobuf_2fdescriptor_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:google.protobuf.FileDescriptorSet)
}